

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureShadowTests.cpp
# Opt level: O1

int __thiscall
deqp::gles3::Functional::Texture2DShadowCase::init(Texture2DShadowCase *this,EVP_PKEY_CTX *ctx)

{
  vector<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_> *this_00;
  float fVar1;
  float fVar2;
  float fVar3;
  deUint32 dVar4;
  int iVar5;
  long lVar6;
  uint uVar7;
  int iVar8;
  int extraout_EAX;
  Texture2D *pTVar9;
  RenderTarget *pRVar10;
  pointer ppTVar11;
  int iVar12;
  int iVar13;
  long lVar14;
  ulong uVar15;
  float fVar16;
  float fVar17;
  deUint32 step;
  anon_struct_24_6_1858ddf2 cases [6];
  undefined1 local_e8 [32];
  Vec4 local_c8;
  undefined8 uStack_b8;
  undefined4 local_b0;
  undefined4 local_ac;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined4 local_98;
  uint local_94;
  undefined8 local_90;
  undefined8 uStack_88;
  undefined4 local_80;
  undefined4 local_7c;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined4 local_68;
  undefined8 local_64;
  undefined8 uStack_5c;
  undefined8 local_54;
  undefined8 local_4c;
  undefined8 uStack_44;
  undefined4 local_3c;
  
  this_00 = &this->m_textures;
  std::vector<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>::reserve(this_00,2);
  pTVar9 = (Texture2D *)operator_new(0x70);
  glu::Texture2D::Texture2D
            (pTVar9,((this->super_TestCase).m_context)->m_renderCtx,this->m_format,this->m_width,
             this->m_height);
  local_c8.m_data._0_8_ = pTVar9;
  std::vector<glu::Texture2D*,std::allocator<glu::Texture2D*>>::emplace_back<glu::Texture2D*>
            ((vector<glu::Texture2D*,std::allocator<glu::Texture2D*>> *)this_00,
             (Texture2D **)&local_c8);
  pTVar9 = (Texture2D *)operator_new(0x70);
  glu::Texture2D::Texture2D
            (pTVar9,((this->super_TestCase).m_context)->m_renderCtx,this->m_format,this->m_width,
             this->m_height);
  local_c8.m_data._0_8_ = pTVar9;
  std::vector<glu::Texture2D*,std::allocator<glu::Texture2D*>>::emplace_back<glu::Texture2D*>
            ((vector<glu::Texture2D*,std::allocator<glu::Texture2D*>> *)this_00,
             (Texture2D **)&local_c8);
  pTVar9 = *(this_00->super__Vector_base<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>).
            _M_impl.super__Vector_impl_data._M_start;
  uVar7 = (int)((long)(pTVar9->m_refTexture).super_TextureLevelPyramid.m_access.
                      super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                *(long *)&(pTVar9->m_refTexture).super_TextureLevelPyramid.m_access.
                          super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                          ._M_impl >> 3) * -0x33333333;
  if (0 < (int)uVar7) {
    lVar14 = 0;
    uVar15 = 0;
    do {
      tcu::Texture2D::allocLevel
                (&(*(this_00->
                    super__Vector_base<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>)._M_impl
                    .super__Vector_impl_data._M_start)->m_refTexture,(int)uVar15);
      local_c8.m_data._0_8_ = (Texture2D *)0xbf000000bf000000;
      local_c8.m_data[2] = -0.5;
      local_c8.m_data[3] = 2.0;
      local_e8._0_8_ = &DAT_3f8000003f800000;
      local_e8._8_4_ = 1.0;
      local_e8._12_4_ = 0.0;
      tcu::fillWithComponentGradients
                ((PixelBufferAccess *)
                 (*(long *)&((*(this_00->
                               super__Vector_base<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>
                               )._M_impl.super__Vector_impl_data._M_start)->m_refTexture).
                            super_TextureLevelPyramid.m_access.
                            super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                            ._M_impl + lVar14),&local_c8,(Vec4 *)local_e8);
      uVar15 = uVar15 + 1;
      lVar14 = lVar14 + 0x28;
    } while ((uVar7 & 0x7fffffff) != uVar15);
  }
  if (0 < (int)uVar7) {
    lVar14 = 0;
    uVar15 = 0;
    do {
      tcu::Texture2D::allocLevel
                (&(this_00->super__Vector_base<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>)
                  ._M_impl.super__Vector_impl_data._M_start[1]->m_refTexture,(int)uVar15);
      lVar6 = *(long *)&((this_00->
                         super__Vector_base<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>).
                         _M_impl.super__Vector_impl_data._M_start[1]->m_refTexture).
                        super_TextureLevelPyramid.m_access.
                        super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                        ._M_impl;
      tcu::RGBA::toVec((RGBA *)&local_c8);
      tcu::RGBA::toVec((RGBA *)local_e8);
      tcu::fillWithGrid((PixelBufferAccess *)(lVar6 + lVar14),4,&local_c8,(Vec4 *)local_e8);
      uVar15 = uVar15 + 1;
      lVar14 = lVar14 + 0x28;
    } while ((uVar7 & 0x7fffffff) != uVar15);
  }
  for (ppTVar11 = (this->m_textures).
                  super__Vector_base<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
      ppTVar11 !=
      (this->m_textures).super__Vector_base<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>.
      _M_impl.super__Vector_impl_data._M_finish; ppTVar11 = ppTVar11 + 1) {
    (*(*ppTVar11)->_vptr_Texture2D[2])();
  }
  dVar4 = this->m_compareFunc;
  if (dVar4 == 0x205 || dVar4 == 0x202) {
    local_94 = 0x3f800000;
  }
  else {
    local_94 = 0x3f000000;
  }
  local_ac = 0;
  if (dVar4 != 0x205 && dVar4 != 0x202) {
    local_ac = 0x3f000000;
  }
  local_c8.m_data._0_8_ = (ulong)local_94 << 0x20;
  local_c8.m_data[2] = 1.6;
  local_c8.m_data[3] = 2.9;
  uStack_b8 = 0xc02ccccdbf800000;
  local_b0 = 0;
  local_a8 = 0xbfaccccdc0000000;
  uStack_a0 = 0x3f333333be4ccccd;
  local_98 = 1;
  local_90 = 0x3e8ccccd3e0f5c29;
  uStack_88 = 0xbf8ccccdbfc00000;
  local_80 = 1;
  local_78 = 0xc028f5c3bf6b851f;
  uStack_70 = 0xbdcccccd3ecccccd;
  local_68 = 1;
  local_64 = 0xbec7ae143f8ccccd;
  uStack_5c = 0x3f266666bf051eb8;
  local_54 = 0x13f5eb852;
  local_4c = 0xbfc66666bdcccccd;
  uStack_44 = 0x3eb333333f266666;
  local_3c = 0x3f68f5c3;
  local_7c = local_ac;
  pRVar10 = Context::getRenderTarget((this->super_TestCase).m_context);
  iVar8 = pRVar10->m_width;
  if (0x3f < iVar8) {
    iVar8 = 0x40;
  }
  pRVar10 = Context::getRenderTarget((this->super_TestCase).m_context);
  iVar12 = 0x40;
  if (pRVar10->m_height < 0x40) {
    iVar12 = pRVar10->m_height;
  }
  lVar14 = 0x14;
  do {
    iVar5 = *(int *)(local_e8 + lVar14 + 0xc);
    ppTVar11 = (this->m_textures).
               super__Vector_base<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>._M_impl.
               super__Vector_impl_data._M_start;
    iVar13 = (int)((ulong)((long)(this->m_textures).
                                 super__Vector_base<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>
                                 ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar11) >> 3)
             + -1;
    if (iVar5 < iVar13) {
      iVar13 = iVar5;
    }
    if (iVar5 < 0) {
      iVar13 = 0;
    }
    fVar1 = *(float *)(local_e8 + lVar14 + 0x10);
    fVar2 = *(float *)(local_e8 + lVar14 + 0x1c);
    fVar3 = *(float *)((long)local_c8.m_data + lVar14);
    fVar17 = *(float *)(local_e8 + lVar14 + 0x18);
    fVar16 = expf(*(float *)(local_e8 + lVar14 + 0x14) * 0.6931472);
    pTVar9 = ppTVar11[iVar13];
    iVar5 = (pTVar9->m_refTexture).m_width;
    fVar17 = expf(fVar17 * 0.6931472);
    local_e8._0_8_ = ppTVar11[iVar13];
    local_e8._12_4_ = fVar3;
    local_e8._8_4_ = fVar2;
    local_e8._20_4_ = (fVar17 * (float)iVar12) / (float)(pTVar9->m_refTexture).m_height + fVar3;
    local_e8._16_4_ = (fVar16 * (float)iVar8) / (float)iVar5 + fVar2;
    local_e8._24_4_ = fVar1;
    std::
    vector<deqp::gles3::Functional::Texture2DShadowCase::FilterCase,_std::allocator<deqp::gles3::Functional::Texture2DShadowCase::FilterCase>_>
    ::emplace_back<deqp::gles3::Functional::Texture2DShadowCase::FilterCase>
              (&this->m_cases,(FilterCase *)local_e8);
    lVar14 = lVar14 + 0x18;
  } while (lVar14 != 0xa4);
  this->m_caseNdx = 0;
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
             "Pass");
  return extraout_EAX;
}

Assistant:

void Texture2DShadowCase::init (void)
{
	try
	{
		// Create 2 textures.
		m_textures.reserve(2);
		m_textures.push_back(new glu::Texture2D(m_context.getRenderContext(), m_format, m_width, m_height));
		m_textures.push_back(new glu::Texture2D(m_context.getRenderContext(), m_format, m_width, m_height));

		int numLevels = m_textures[0]->getRefTexture().getNumLevels();

		// Fill first gradient texture.
		for (int levelNdx = 0; levelNdx < numLevels; levelNdx++)
		{
			m_textures[0]->getRefTexture().allocLevel(levelNdx);
			tcu::fillWithComponentGradients(m_textures[0]->getRefTexture().getLevel(levelNdx), tcu::Vec4(-0.5f, -0.5f, -0.5f, 2.0f), tcu::Vec4(1.0f, 1.0f, 1.0f, 0.0f));
		}

		// Fill second with grid texture.
		for (int levelNdx = 0; levelNdx < numLevels; levelNdx++)
		{
			deUint32	step	= 0x00ffffff / numLevels;
			deUint32	rgb		= step*levelNdx;
			deUint32	colorA	= 0xff000000 | rgb;
			deUint32	colorB	= 0xff000000 | ~rgb;

			m_textures[1]->getRefTexture().allocLevel(levelNdx);
			tcu::fillWithGrid(m_textures[1]->getRefTexture().getLevel(levelNdx), 4, tcu::RGBA(colorA).toVec(), tcu::RGBA(colorB).toVec());
		}

		// Upload.
		for (std::vector<glu::Texture2D*>::iterator i = m_textures.begin(); i != m_textures.end(); i++)
			(*i)->upload();
	}
	catch (const std::exception&)
	{
		// Clean up to save memory.
		Texture2DShadowCase::deinit();
		throw;
	}

	// Compute cases.
	{
		const float refInRangeUpper		= (m_compareFunc == GL_EQUAL || m_compareFunc == GL_NOTEQUAL) ? 1.0f : 0.5f;
		const float refInRangeLower		= (m_compareFunc == GL_EQUAL || m_compareFunc == GL_NOTEQUAL) ? 0.0f : 0.5f;
		const float refOutOfBoundsUpper	= 1.1f;		// !< lookup function should clamp values to [0, 1] range
		const float refOutOfBoundsLower	= -0.1f;

		const struct
		{
			int		texNdx;
			float	ref;
			float	lodX;
			float	lodY;
			float	oX;
			float	oY;
		} cases[] =
		{
			{ 0,	refInRangeUpper,		1.6f,	2.9f,	-1.0f,	-2.7f	},
			{ 0,	refInRangeLower,		-2.0f,	-1.35f,	-0.2f,	0.7f	},
			{ 1,	refInRangeUpper,		0.14f,	0.275f,	-1.5f,	-1.1f	},
			{ 1,	refInRangeLower,		-0.92f,	-2.64f,	0.4f,	-0.1f	},
			{ 1,	refOutOfBoundsUpper,	-0.39f,	-0.52f,	0.65f,	0.87f	},
			{ 1,	refOutOfBoundsLower,	-1.55f,	0.65f,	0.35f,	0.91f	},
		};

		const float	viewportW	= (float)de::min<int>(TEX2D_VIEWPORT_WIDTH, m_context.getRenderTarget().getWidth());
		const float	viewportH	= (float)de::min<int>(TEX2D_VIEWPORT_HEIGHT, m_context.getRenderTarget().getHeight());

		for (int caseNdx = 0; caseNdx < DE_LENGTH_OF_ARRAY(cases); caseNdx++)
		{
			const int	texNdx	= de::clamp(cases[caseNdx].texNdx, 0, (int)m_textures.size()-1);
			const float ref		= cases[caseNdx].ref;
			const float	lodX	= cases[caseNdx].lodX;
			const float	lodY	= cases[caseNdx].lodY;
			const float	oX		= cases[caseNdx].oX;
			const float	oY		= cases[caseNdx].oY;
			const float	sX		= deFloatExp2(lodX)*viewportW / float(m_textures[texNdx]->getRefTexture().getWidth());
			const float	sY		= deFloatExp2(lodY)*viewportH / float(m_textures[texNdx]->getRefTexture().getHeight());

			m_cases.push_back(FilterCase(m_textures[texNdx], ref, tcu::Vec2(oX, oY), tcu::Vec2(oX+sX, oY+sY)));
		}
	}

	m_caseNdx = 0;
	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
}